

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O0

mz_ulong mz_adler32(mz_ulong adler,uchar *ptr,size_t buf_len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 local_40;
  size_t block_len;
  undefined4 local_30;
  mz_uint32 s2;
  mz_uint32 s1;
  mz_uint32 i;
  size_t buf_len_local;
  uchar *ptr_local;
  mz_ulong adler_local;
  
  local_30 = (uint)adler & 0xffff;
  block_len._4_4_ = (uint)(adler >> 0x10);
  local_40 = buf_len % 0x15b0;
  _s1 = buf_len;
  buf_len_local = (size_t)ptr;
  if (ptr == (uchar *)0x0) {
    adler_local = 1;
  }
  else {
    while (_s1 != 0) {
      for (s2 = 0; s2 + 7 < local_40; s2 = s2 + 8) {
        iVar1 = *(byte *)buf_len_local + local_30;
        iVar2 = (uint)*(byte *)(buf_len_local + 1) + iVar1;
        iVar3 = (uint)*(byte *)(buf_len_local + 2) + iVar2;
        iVar4 = (uint)*(byte *)(buf_len_local + 3) + iVar3;
        iVar5 = (uint)*(byte *)(buf_len_local + 4) + iVar4;
        iVar6 = (uint)*(byte *)(buf_len_local + 5) + iVar5;
        iVar7 = (uint)*(byte *)(buf_len_local + 6) + iVar6;
        local_30 = (uint)*(byte *)(buf_len_local + 7) + iVar7;
        block_len._4_4_ =
             local_30 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + iVar1 + block_len._4_4_;
        buf_len_local = buf_len_local + 8;
      }
      for (; s2 < local_40; s2 = s2 + 1) {
        local_30 = *(byte *)buf_len_local + local_30;
        block_len._4_4_ = local_30 + block_len._4_4_;
        buf_len_local = buf_len_local + 1;
      }
      local_30 = local_30 % 0xfff1;
      block_len._4_4_ = block_len._4_4_ % 0xfff1;
      _s1 = _s1 - local_40;
      local_40 = 0x15b0;
    }
    adler_local = (mz_ulong)(block_len._4_4_ * 0x10000 + local_30);
  }
  return adler_local;
}

Assistant:

mz_ulong mz_adler32(mz_ulong adler, const unsigned char *ptr, size_t buf_len)
{
  mz_uint32 i, s1 = (mz_uint32)(adler & 0xffff), s2 = (mz_uint32)(adler >> 16); size_t block_len = buf_len % 5552;
  if (!ptr) return MZ_ADLER32_INIT;
  while (buf_len) {
    for (i = 0; i + 7 < block_len; i += 8, ptr += 8) {
      s1 += ptr[0], s2 += s1; s1 += ptr[1], s2 += s1; s1 += ptr[2], s2 += s1; s1 += ptr[3], s2 += s1;
      s1 += ptr[4], s2 += s1; s1 += ptr[5], s2 += s1; s1 += ptr[6], s2 += s1; s1 += ptr[7], s2 += s1;
    }
    for ( ; i < block_len; ++i) s1 += *ptr++, s2 += s1;
    s1 %= 65521U, s2 %= 65521U; buf_len -= block_len; block_len = 5552;
  }
  return (s2 << 16) + s1;
}